

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall leveldb::log::LogTest_Empty_Test::TestBody(LogTest_Empty_Test *this)

{
  char *message;
  internal local_48 [8];
  undefined8 *local_40;
  AssertHelper local_38;
  string local_30;
  
  LogTest::Read_abi_cxx11_(&local_30,&this->super_LogTest);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            (local_48,"\"EOF\"","Read()",(char (*) [4])"EOF",&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_40 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x105,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_40 != local_40 + 2) {
      operator_delete((undefined8 *)*local_40);
    }
    operator_delete(local_40);
  }
  return;
}

Assistant:

TEST_F(LogTest, Empty) { ASSERT_EQ("EOF", Read()); }